

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

void uv__drain(uv_stream_t *stream)

{
  uv_shutdown_t *puVar1;
  int iVar2;
  int *piVar3;
  int local_1c;
  int err;
  uv_shutdown_t *req;
  uv_stream_t *stream_local;
  
  if (stream->write_queue != (void **)stream->write_queue[0]) {
    __assert_fail("QUEUE_EMPTY(&stream->write_queue)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/libuv/src/unix/stream.c"
                  ,0x296,"void uv__drain(uv_stream_t *)");
  }
  if ((stream->flags & 1) == 0) {
    uv__io_stop(stream->loop,&stream->io_watcher,4);
    uv__stream_osx_interrupt_select(stream);
  }
  if ((stream->flags & 0x100) != 0) {
    puVar1 = stream->shutdown_req;
    if (puVar1 == (uv_shutdown_t *)0x0) {
      __assert_fail("req",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/libuv/src/unix/stream.c"
                    ,0x2a0,"void uv__drain(uv_stream_t *)");
    }
    if (((stream->flags & 1) != 0) || ((stream->flags & 0x200) == 0)) {
      stream->shutdown_req = (uv_shutdown_t *)0x0;
      stream->flags = stream->flags & 0xfffffeff;
      if ((stream->loop->active_reqs).count == 0) {
        __assert_fail("uv__has_active_reqs(stream->loop)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/libuv/src/unix/stream.c"
                      ,0x2a6,"void uv__drain(uv_stream_t *)");
      }
      (stream->loop->active_reqs).count = (stream->loop->active_reqs).count - 1;
      local_1c = 0;
      if ((stream->flags & 1) == 0) {
        iVar2 = shutdown((stream->io_watcher).fd,1);
        if (iVar2 == 0) {
          stream->flags = stream->flags | 0x200;
        }
        else {
          piVar3 = __errno_location();
          local_1c = -*piVar3;
        }
      }
      else {
        local_1c = -0x7d;
      }
      if (puVar1->cb != (uv_shutdown_cb)0x0) {
        (*puVar1->cb)(puVar1,local_1c);
      }
    }
  }
  return;
}

Assistant:

static void uv__drain(uv_stream_t* stream) {
  uv_shutdown_t* req;
  int err;

  assert(QUEUE_EMPTY(&stream->write_queue));
  if (!(stream->flags & UV_HANDLE_CLOSING)) {
    uv__io_stop(stream->loop, &stream->io_watcher, POLLOUT);
    uv__stream_osx_interrupt_select(stream);
  }

  if (!(stream->flags & UV_HANDLE_SHUTTING))
    return;

  req = stream->shutdown_req;
  assert(req);

  if ((stream->flags & UV_HANDLE_CLOSING) ||
      !(stream->flags & UV_HANDLE_SHUT)) {
    stream->shutdown_req = NULL;
    stream->flags &= ~UV_HANDLE_SHUTTING;
    uv__req_unregister(stream->loop, req);

    err = 0;
    if (stream->flags & UV_HANDLE_CLOSING)
      /* The user destroyed the stream before we got to do the shutdown. */
      err = UV_ECANCELED;
    else if (shutdown(uv__stream_fd(stream), SHUT_WR))
      err = UV__ERR(errno);
    else /* Success. */
      stream->flags |= UV_HANDLE_SHUT;

    if (req->cb != NULL)
      req->cb(req, err);
  }
}